

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)this->_toYa;
  if (__mutex == (pthread_mutex_t *)0x0) {
    TiledOutputFile::writeTile(this->_outputFile,dx,dy,lx,ly);
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    ToYa::writeTile(this->_toYa,dx,dy,lx,ly);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        _toYa->writeTile (dx, dy, lx, ly);
    }
    else { _outputFile->writeTile (dx, dy, lx, ly); }
}